

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# alprd.cpp
# Opt level: O2

CompressionFunction *
duckdb::AlpRDCompressionFun::GetFunction
          (CompressionFunction *__return_storage_ptr__,PhysicalType type)

{
  InternalException *this;
  int iVar1;
  undefined7 in_register_00000031;
  allocator local_39;
  string local_38;
  
  iVar1 = (int)CONCAT71(in_register_00000031,type);
  if (iVar1 == 0xc) {
    GetAlpRDFunction<double>(DOUBLE);
  }
  else {
    if (iVar1 != 0xb) {
      this = (InternalException *)__cxa_allocate_exception(0x10);
      ::std::__cxx11::string::string((string *)&local_38,"Unsupported type for Alp",&local_39);
      InternalException::InternalException(this,&local_38);
      __cxa_throw(this,&InternalException::typeinfo,::std::runtime_error::~runtime_error);
    }
    GetAlpRDFunction<float>(FLOAT);
  }
  return __return_storage_ptr__;
}

Assistant:

CompressionFunction AlpRDCompressionFun::GetFunction(PhysicalType type) {
	switch (type) {
	case PhysicalType::FLOAT:
		return GetAlpRDFunction<float>(type);
	case PhysicalType::DOUBLE:
		return GetAlpRDFunction<double>(type);
	default:
		throw InternalException("Unsupported type for Alp");
	}
}